

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void * __thiscall LockedPool::alloc(LockedPool *this,size_t size)

{
  long lVar1;
  bool bVar2;
  Arena *this_00;
  ulong in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t in_stack_00000028;
  void *addr;
  LockedPageArena *arena;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *__range1;
  iterator __end1;
  iterator __begin1;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffff68;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
  *in_stack_ffffffffffffff70;
  _Self *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  reference in_stack_ffffffffffffffb0;
  void *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff68,(mutex_type *)0x894b61);
  if ((in_RSI == 0) || (0x40000 < in_RSI)) {
    local_28 = (void *)0x0;
  }
  else {
    this_00 = (Arena *)(in_RDI + 8);
    std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::
    begin(in_stack_ffffffffffffff70);
    std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::
    end(in_stack_ffffffffffffff70);
    while (bVar2 = std::operator==(in_stack_ffffffffffffff78,(_Self *)in_stack_ffffffffffffff70),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffffb0 =
           std::_List_iterator<LockedPool::LockedPageArena>::operator*
                     ((_List_iterator<LockedPool::LockedPageArena> *)in_stack_ffffffffffffff68);
      local_28 = Arena::alloc(this_00,in_stack_00000028);
      if (local_28 != (void *)0x0) goto LAB_00894cca;
      std::_List_iterator<LockedPool::LockedPageArena>::operator++
                ((_List_iterator<LockedPool::LockedPageArena> *)in_stack_ffffffffffffff68);
    }
    bVar2 = new_arena((LockedPool *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                      (size_t)this_00,(size_t)in_stack_ffffffffffffffb0);
    if (bVar2) {
      std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
      ::back(in_stack_ffffffffffffff70);
      local_28 = Arena::alloc(this_00,in_stack_00000028);
    }
    else {
      local_28 = (void *)0x0;
    }
  }
LAB_00894cca:
  std::lock_guard<std::mutex>::~lock_guard(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

void* LockedPool::alloc(size_t size)
{
    std::lock_guard<std::mutex> lock(mutex);

    // Don't handle impossible sizes
    if (size == 0 || size > ARENA_SIZE)
        return nullptr;

    // Try allocating from each current arena
    for (auto &arena: arenas) {
        void *addr = arena.alloc(size);
        if (addr) {
            return addr;
        }
    }
    // If that fails, create a new one
    if (new_arena(ARENA_SIZE, ARENA_ALIGN)) {
        return arenas.back().alloc(size);
    }
    return nullptr;
}